

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  int iVar1;
  ImGuiWindow *window;
  bool bVar2;
  long lVar3;
  ImGuiWindow *window_00;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = (GImGui->WindowsFocusOrder).Size;
  uVar4 = iVar1 - 1;
  lVar5 = (long)iVar1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    do {
      if (lVar5 < 1) {
        lVar6 = 0xffffffff;
        break;
      }
      lVar6 = lVar5 + -1;
      lVar3 = lVar5 + -1;
      lVar5 = lVar6;
    } while ((GImGui->WindowsFocusOrder).Data[lVar3] != under_this_window);
    if ((int)lVar6 != -1) {
      uVar4 = (int)lVar6 - 1;
    }
  }
  if ((int)uVar4 < 0) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = (ImGuiWindow *)0x0;
    lVar5 = (ulong)uVar4 + 1;
    do {
      window = (GImGui->WindowsFocusOrder).Data[lVar5 + -1];
      if (((window != ignore_window) && (window->WasActive == true)) &&
         ((~window->Flags & 0x40200U) != 0 && (window->Flags & 0x1000000U) == 0)) {
        window_00 = NavRestoreLastChildNavWindow(window);
        break;
      }
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}